

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::Generate
          (SharedCodeGenerator *this,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_file_list)

{
  bool bVar1;
  int iVar2;
  ClassNameResolver *this_00;
  undefined4 extraout_var;
  Printer *pPVar3;
  ZeroCopyOutputStream *pZVar4;
  string *psVar5;
  ulong uVar6;
  undefined4 extraout_var_00;
  AnnotationCollector *local_1f8;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_1b8;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> info_output;
  string local_1a8;
  undefined1 local_188 [8];
  string info_full_path;
  string info_relative_path;
  scoped_ptr<google::protobuf::io::Printer> printer;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output;
  undefined1 local_d8 [8];
  string filename;
  string classname;
  string local_88;
  undefined1 local_68 [8];
  string package_dir;
  string java_package;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *annotation_file_list_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *file_list_local;
  GeneratorContext *context_local;
  SharedCodeGenerator *this_local;
  
  FileJavaPackage_abi_cxx11_
            ((string *)(package_dir.field_2._M_local_buf + 8),(java *)this->file_,
             (FileDescriptor *)0x1,SUB81(annotation_file_list,0));
  std::__cxx11::string::string((string *)&local_88,(string *)(package_dir.field_2._M_local_buf + 8))
  ;
  JavaPackageToDir((string *)local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = HasDescriptorMethods(this->file_,(bool)((this->options_).enforce_lite & 1));
  if (bVar1) {
    this_00 = internal::scoped_ptr<google::protobuf::compiler::java::ClassNameResolver>::operator->
                        (&this->name_resolver_);
    ClassNameResolver::GetDescriptorClassName_abi_cxx11_
              ((string *)((long)&filename.field_2 + 8),this_00,this->file_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&filename.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                   ".java");
    std::__cxx11::string::~string((string *)&output);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(file_list,(value_type *)local_d8);
    iVar2 = (*context->_vptr_GeneratorContext[2])(context,local_d8);
    internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
              ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
               &annotations.annotation_.super_RepeatedPtrFieldBase.rep_,
               (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2));
    GeneratedCodeInfo::GeneratedCodeInfo
              ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
    io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AnnotationProtoCollector
              ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)&printer,
               (GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
    pPVar3 = (Printer *)operator_new(0x88);
    pZVar4 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get
                       ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
                        &annotations.annotation_.super_RepeatedPtrFieldBase.rep_);
    if (((this->options_).annotate_code & 1U) == 0) {
      local_1f8 = (AnnotationCollector *)0x0;
    }
    else {
      local_1f8 = (AnnotationCollector *)&printer;
    }
    io::Printer::Printer(pPVar3,pZVar4,'$',local_1f8);
    internal::scoped_ptr<google::protobuf::io::Printer>::scoped_ptr
              ((scoped_ptr<google::protobuf::io::Printer> *)((long)&info_relative_path.field_2 + 8),
               pPVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&info_full_path.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&filename.field_2 + 8),".java.pb.meta");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   ".pb.meta");
    pPVar3 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->
                       ((scoped_ptr<google::protobuf::io::Printer> *)
                        ((long)&info_relative_path.field_2 + 8));
    psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
    io::Printer::Print(pPVar3,
                       "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                       ,"filename",psVar5);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      pPVar3 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->
                         ((scoped_ptr<google::protobuf::io::Printer> *)
                          ((long)&info_relative_path.field_2 + 8));
      io::Printer::Print(pPVar3,"package $package$;\n\n","package",
                         (string *)((long)&package_dir.field_2 + 8));
    }
    pPVar3 = internal::scoped_ptr<google::protobuf::io::Printer>::get
                       ((scoped_ptr<google::protobuf::io::Printer> *)
                        ((long)&info_relative_path.field_2 + 8));
    info_output.ptr_._6_1_ = 0;
    if (((this->options_).annotate_code & 1U) == 0) {
      std::allocator<char>::allocator();
      info_output.ptr_._6_1_ = 1;
      std::__cxx11::string::string
                ((string *)&local_1a8,"",(allocator *)((long)&info_output.ptr_ + 7));
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_1a8,(string *)(info_full_path.field_2._M_local_buf + 8));
    }
    PrintGeneratedAnnotation(pPVar3,'$',&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if ((info_output.ptr_._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&info_output.ptr_ + 7));
    }
    pPVar3 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->
                       ((scoped_ptr<google::protobuf::io::Printer> *)
                        ((long)&info_relative_path.field_2 + 8));
    io::Printer::Print(pPVar3,
                       "public final class $classname$ {\n  public static com.google.protobuf.Descriptors.FileDescriptor\n      descriptor;\n  static {\n"
                       ,"classname",(string *)((long)&filename.field_2 + 8));
    pPVar3 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->
                       ((scoped_ptr<google::protobuf::io::Printer> *)
                        ((long)&info_relative_path.field_2 + 8));
    psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
    io::Printer::Annotate(pPVar3,"classname",psVar5);
    pPVar3 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->
                       ((scoped_ptr<google::protobuf::io::Printer> *)
                        ((long)&info_relative_path.field_2 + 8));
    io::Printer::Indent(pPVar3);
    pPVar3 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->
                       ((scoped_ptr<google::protobuf::io::Printer> *)
                        ((long)&info_relative_path.field_2 + 8));
    io::Printer::Indent(pPVar3);
    pPVar3 = internal::scoped_ptr<google::protobuf::io::Printer>::get
                       ((scoped_ptr<google::protobuf::io::Printer> *)
                        ((long)&info_relative_path.field_2 + 8));
    GenerateDescriptors(this,pPVar3);
    pPVar3 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->
                       ((scoped_ptr<google::protobuf::io::Printer> *)
                        ((long)&info_relative_path.field_2 + 8));
    io::Printer::Outdent(pPVar3);
    pPVar3 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->
                       ((scoped_ptr<google::protobuf::io::Printer> *)
                        ((long)&info_relative_path.field_2 + 8));
    io::Printer::Outdent(pPVar3);
    pPVar3 = internal::scoped_ptr<google::protobuf::io::Printer>::operator->
                       ((scoped_ptr<google::protobuf::io::Printer> *)
                        ((long)&info_relative_path.field_2 + 8));
    io::Printer::Print(pPVar3,"  }\n}\n");
    if (((this->options_).annotate_code & 1U) != 0) {
      iVar2 = (*context->_vptr_GeneratorContext[2])(context,local_188);
      internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
                (&local_1b8,(ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar2));
      pZVar4 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_1b8);
      MessageLite::SerializeToZeroCopyStream
                ((MessageLite *)&annotation_collector.annotation_proto_,pZVar4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(annotation_file_list,(value_type *)local_188);
      internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_1b8);
    }
    internal::scoped_ptr<google::protobuf::io::Printer>::reset
              ((scoped_ptr<google::protobuf::io::Printer> *)((long)&info_relative_path.field_2 + 8),
               (Printer *)0x0);
    internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::reset
              ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
               &annotations.annotation_.super_RepeatedPtrFieldBase.rep_,(ZeroCopyOutputStream *)0x0)
    ;
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::~string((string *)(info_full_path.field_2._M_local_buf + 8));
    internal::scoped_ptr<google::protobuf::io::Printer>::~scoped_ptr
              ((scoped_ptr<google::protobuf::io::Printer> *)((long)&info_relative_path.field_2 + 8))
    ;
    io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::~AnnotationProtoCollector
              ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)&printer);
    GeneratedCodeInfo::~GeneratedCodeInfo
              ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
    internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr
              ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
               &annotations.annotation_.super_RepeatedPtrFieldBase.rep_);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(package_dir.field_2._M_local_buf + 8));
  return;
}

Assistant:

void SharedCodeGenerator::Generate(GeneratorContext* context,
                                   std::vector<string>* file_list,
                                   std::vector<string>* annotation_file_list) {
  string java_package = FileJavaPackage(file_);
  string package_dir = JavaPackageToDir(java_package);

  if (HasDescriptorMethods(file_, options_.enforce_lite)) {
    // Generate descriptors.
    string classname = name_resolver_->GetDescriptorClassName(file_);
    string filename = package_dir + classname + ".java";
    file_list->push_back(filename);
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    google::protobuf::scoped_ptr<io::Printer> printer(
        new io::Printer(output.get(), '$',
                        options_.annotate_code ? &annotation_collector : NULL));
    string info_relative_path = classname + ".java.pb.meta";
    string info_full_path = filename + ".pb.meta";
    printer->Print(
        "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
        "// source: $filename$\n"
        "\n",
        "filename", file_->name());
    if (!java_package.empty()) {
      printer->Print(
        "package $package$;\n"
        "\n",
        "package", java_package);
    }
    PrintGeneratedAnnotation(printer.get(), '$',
                             options_.annotate_code ? info_relative_path : "");
    printer->Print(
        "public final class $classname$ {\n"
        "  public static com.google.protobuf.Descriptors.FileDescriptor\n"
        "      descriptor;\n"
        "  static {\n",
        "classname", classname);
    printer->Annotate("classname", file_->name());
    printer->Indent();
    printer->Indent();
    GenerateDescriptors(printer.get());
    printer->Outdent();
    printer->Outdent();
    printer->Print(
      "  }\n"
      "}\n");

    if (options_.annotate_code) {
      google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
      annotation_file_list->push_back(info_full_path);
    }

    printer.reset();
    output.reset();
  }
}